

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_load.c
# Opt level: O0

int cmd_load_dep(yl_opt *yo,int posc)

{
  int posc_local;
  yl_opt *yo_local;
  
  if ((yo->interactive == '\0') || (posc != 0)) {
    if ((yo->schema_features).count == 0) {
      yo->ctx_options = yo->ctx_options | 0x100;
    }
    yo_local._4_4_ = 0;
  }
  else {
    cmd_load_help();
    yo_local._4_4_ = 1;
  }
  return yo_local._4_4_;
}

Assistant:

int
cmd_load_dep(struct yl_opt *yo, int posc)
{
    if (yo->interactive && !posc) {
        /* no argument */
        cmd_load_help();
        return 1;
    }

    if (!yo->schema_features.count) {
        /* no features, enable all of them */
        yo->ctx_options |= LY_CTX_ENABLE_IMP_FEATURES;
    }

    return 0;
}